

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SRes LzmaDec_DecodeToDic(CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,
                        ELzmaFinishMode finishMode,ELzmaStatus *status)

{
  Byte *buf;
  Byte BVar1;
  UInt16 *pUVar2;
  Byte *pBVar3;
  ELzmaDummy EVar4;
  int iVar5;
  uint uVar6;
  ELzmaStatus EVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ELzmaStatus *pEVar15;
  ulong uVar16;
  Byte *pBVar17;
  SizeT inSize;
  bool bVar18;
  Byte *local_48;
  
  inSize = *srcLen;
  *srcLen = 0;
  pEVar15 = status;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  buf = p->tempBuf;
  do {
    uVar14 = (uint)pEVar15;
    uVar12 = p->remainLen;
    if (uVar12 == 0x112) {
      if (p->code == 0) {
        *status = LZMA_STATUS_FINISHED_WITH_MARK;
      }
      return (uint)(p->code != 0);
    }
    if (p->needFlush == 0) {
LAB_00113178:
      uVar11 = p->dicPos;
      if (uVar11 < dicLimit) {
LAB_001131b5:
        if (p->needInitState != 0) {
          uVar12 = (p->prop).lp;
          uVar6 = (p->prop).lc;
          pUVar2 = p->probs;
          uVar9 = 0;
          do {
            pUVar2[uVar9] = 0x400;
            uVar9 = uVar9 + 1;
          } while ((0x300 << ((char)uVar12 + (char)uVar6 & 0x1fU)) + 0x736 != uVar9);
          p->reps[3] = 1;
          p->reps[1] = 1;
          p->reps[2] = 1;
          p->state = 0;
          p->reps[0] = 1;
          p->needInitState = 0;
        }
        uVar12 = p->tempBufSize;
        uVar9 = (ulong)uVar12;
        if (uVar9 == 0) {
          if (inSize < 0x14 || dicLimit <= uVar11) {
            pEVar15 = (ELzmaStatus *)((ulong)pEVar15 & 0xffffffff);
            EVar4 = LzmaDec_TryDummy(p,src,inSize);
            if (EVar4 == DUMMY_ERROR) {
              memcpy(buf,src,inSize);
              p->tempBufSize = (uint)inSize;
              *srcLen = *srcLen + inSize;
              pEVar15 = (ELzmaStatus *)0x0;
              EVar7 = LZMA_STATUS_NEEDS_MORE_INPUT;
LAB_00113402:
              *status = EVar7;
              bVar18 = false;
              pBVar17 = local_48;
            }
            else {
              bVar18 = true;
              pBVar17 = src;
              if ((dicLimit <= uVar11) && (EVar4 != DUMMY_MATCH)) {
                pEVar15 = (ELzmaStatus *)0x1;
                EVar7 = LZMA_STATUS_NOT_FINISHED;
                goto LAB_00113402;
              }
            }
            if (bVar18) {
              uVar14 = (uint)pEVar15;
              goto LAB_00113417;
            }
            bVar18 = false;
          }
          else {
            pBVar17 = src + (inSize - 0x14);
LAB_00113417:
            p->buf = src;
            iVar5 = LzmaDec_DecodeReal2(p,dicLimit,pBVar17);
            if (iVar5 == 0) {
              pBVar3 = p->buf;
              lVar8 = (long)pBVar3 - (long)src;
              *srcLen = *srcLen + lVar8;
              inSize = inSize - lVar8;
              bVar18 = true;
              pEVar15 = (ELzmaStatus *)(ulong)uVar14;
              src = pBVar3;
            }
            else {
              pEVar15 = (ELzmaStatus *)0x1;
              bVar18 = false;
            }
          }
          local_48 = pBVar17;
          if (!bVar18) {
            bVar18 = false;
            goto LAB_001134a8;
          }
        }
        else {
          uVar10 = 0;
          bVar18 = uVar12 < 0x14;
          if (bVar18) {
            uVar16 = 0;
            if (inSize != 0) {
              uVar16 = 0;
              do {
                pBVar17 = src + uVar16;
                uVar16 = uVar16 + 1;
                p->tempBuf[uVar9] = *pBVar17;
                bVar18 = uVar9 < 0x13;
                if (!bVar18) break;
                uVar9 = uVar9 + 1;
              } while (uVar16 < inSize);
              uVar9 = (ulong)(uVar12 + (int)uVar16);
              uVar10 = uVar16 & 0xffffffff;
            }
          }
          else {
            uVar16 = 0;
          }
          uVar12 = (uint)uVar9;
          p->tempBufSize = uVar12;
          if ((bool)(uVar11 < dicLimit & (bVar18 ^ 1U))) {
LAB_00113362:
            p->buf = buf;
            iVar5 = LzmaDec_DecodeReal2(p,dicLimit,buf);
            if (iVar5 == 0) {
              uVar6 = *(int *)&p->buf - (int)buf;
              pEVar15 = (ELzmaStatus *)0xb;
              uVar13 = uVar12 - uVar6;
              if (uVar12 < uVar6) {
                bVar18 = false;
              }
              else if ((uint)uVar10 < uVar13) {
                bVar18 = false;
              }
              else {
                bVar18 = true;
                uVar10 = (ulong)((uint)uVar10 - uVar13);
                pEVar15 = (ELzmaStatus *)(ulong)uVar14;
              }
              if (!bVar18) goto LAB_0011349c;
              *srcLen = *srcLen + uVar10;
              src = src + uVar10;
              inSize = inSize - uVar10;
              p->tempBufSize = 0;
              bVar18 = true;
            }
            else {
              pEVar15 = (ELzmaStatus *)0x1;
              bVar18 = false;
            }
          }
          else {
            EVar4 = LzmaDec_TryDummy(p,buf,uVar9);
            if (EVar4 == DUMMY_ERROR) {
              *srcLen = *srcLen + uVar16;
              pEVar15 = (ELzmaStatus *)0x0;
              EVar7 = LZMA_STATUS_NEEDS_MORE_INPUT;
LAB_00113351:
              *status = EVar7;
              bVar18 = false;
            }
            else {
              bVar18 = true;
              if (uVar11 < dicLimit) {
                pEVar15 = (ELzmaStatus *)((ulong)pEVar15 & 0xffffffff);
              }
              else {
                pEVar15 = (ELzmaStatus *)((ulong)pEVar15 & 0xffffffff);
                if (EVar4 != DUMMY_MATCH) {
                  pEVar15 = (ELzmaStatus *)0x1;
                  EVar7 = LZMA_STATUS_NOT_FINISHED;
                  goto LAB_00113351;
                }
              }
            }
            uVar14 = (uint)pEVar15;
            if (bVar18) goto LAB_00113362;
LAB_0011349c:
            bVar18 = false;
          }
          if (!bVar18) goto LAB_001134a6;
        }
        bVar18 = true;
      }
      else {
        if ((uVar12 == 0) && (p->code == 0)) {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        }
        else {
          if (finishMode != LZMA_FINISH_ANY) {
            if (uVar12 != 0) {
              *status = LZMA_STATUS_NOT_FINISHED;
              goto LAB_001131aa;
            }
            goto LAB_001131b5;
          }
          *status = LZMA_STATUS_NOT_FINISHED;
        }
LAB_001133be:
        bVar18 = false;
        pEVar15 = (ELzmaStatus *)0x0;
      }
    }
    else {
      if (inSize != 0) {
        uVar6 = p->tempBufSize;
        uVar9 = 5;
        uVar11 = (ulong)uVar6;
        if (5 < uVar6) {
          uVar9 = (ulong)uVar6;
        }
        do {
          if (uVar9 == uVar11) break;
          BVar1 = *src;
          p->tempBufSize = (uint)(uVar11 + 1);
          p->tempBuf[uVar11] = BVar1;
          *srcLen = *srcLen + 1;
          src = src + 1;
          inSize = inSize - 1;
          uVar11 = uVar11 + 1;
        } while (inSize != 0);
      }
      if (p->tempBufSize < 5) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        goto LAB_001133be;
      }
      if (p->tempBuf[0] == '\0') {
        uVar6 = *(uint *)(p->tempBuf + 1);
        p->code = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        p->range = 0xffffffff;
        p->needFlush = 0;
        p->tempBufSize = 0;
        goto LAB_00113178;
      }
LAB_001131aa:
      pEVar15 = (ELzmaStatus *)0x1;
LAB_001134a6:
      bVar18 = false;
    }
LAB_001134a8:
    if (!bVar18) {
      return (SRes)pEVar15;
    }
  } while( true );
}

Assistant:

static SRes LzmaDec_DecodeToDic(CLzmaDec *p, SizeT dicLimit, const Byte *src, SizeT *srcLen,
    ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);
  
  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart)
  {
      int checkEndMarkNow;

      if (p->needFlush)
      {
        for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
          p->tempBuf[p->tempBufSize++] = *src++;
        if (p->tempBufSize < RC_INIT_SIZE)
        {
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (p->tempBuf[0] != 0)
          return SZ_ERROR_DATA;
        p->code =
              ((UInt32)p->tempBuf[1] << 24)
            | ((UInt32)p->tempBuf[2] << 16)
            | ((UInt32)p->tempBuf[3] << 8)
            | ((UInt32)p->tempBuf[4]);
        p->range = 0xFFFFFFFF;
        p->needFlush = 0;
        p->tempBufSize = 0;
      }

      checkEndMarkNow = 0;
      if (p->dicPos >= dicLimit)
      {
        if (p->remainLen == 0 && p->code == 0)
        {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
          return SZ_OK;
        }
        if (finishMode == LZMA_FINISH_ANY)
        {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_OK;
        }
        if (p->remainLen != 0)
        {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        checkEndMarkNow = 1;
      }

      if (p->needInitState)
        LzmaDec_InitStateReal(p);
  
      if (p->tempBufSize == 0)
      {
        SizeT processed;
        const Byte *bufLimit;
        if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow)
        {
          int dummyRes = LzmaDec_TryDummy(p, src, inSize);
          if (dummyRes == DUMMY_ERROR)
          {
            memcpy(p->tempBuf, src, inSize);
            p->tempBufSize = (unsigned)inSize;
            (*srcLen) += inSize;
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return SZ_OK;
          }
          if (checkEndMarkNow && dummyRes != DUMMY_MATCH)
          {
            *status = LZMA_STATUS_NOT_FINISHED;
            return SZ_ERROR_DATA;
          }
          bufLimit = src;
        }
        else
          bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
        p->buf = src;
        if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
          return SZ_ERROR_DATA;
        processed = (SizeT)(p->buf - src);
        (*srcLen) += processed;
        src += processed;
        inSize -= processed;
      }
      else
      {
        unsigned rem = p->tempBufSize, lookAhead = 0;
        while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
          p->tempBuf[rem++] = src[lookAhead++];
        p->tempBufSize = rem;
        if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow)
        {
          int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
          if (dummyRes == DUMMY_ERROR)
          {
            (*srcLen) += lookAhead;
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return SZ_OK;
          }
          if (checkEndMarkNow && dummyRes != DUMMY_MATCH)
          {
            *status = LZMA_STATUS_NOT_FINISHED;
            return SZ_ERROR_DATA;
          }
        }
        p->buf = p->tempBuf;
        if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
          return SZ_ERROR_DATA;
        
        {
          unsigned kkk = (unsigned)(p->buf - p->tempBuf);
          if (rem < kkk)
            return SZ_ERROR_FAIL; /* some internal error */
          rem -= kkk;
          if (lookAhead < rem)
            return SZ_ERROR_FAIL; /* some internal error */
          lookAhead -= rem;
        }
        (*srcLen) += lookAhead;
        src += lookAhead;
        inSize -= lookAhead;
        p->tempBufSize = 0;
      }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}